

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O2

void LoadActors(void)

{
  long lVar1;
  bool bVar2;
  FScriptPosition *pFVar3;
  FState *pFVar4;
  bool *pbVar5;
  Node *pNVar6;
  PClassActor *pPVar7;
  PClassActor *pPVar8;
  char *pcVar9;
  PClass *pPVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  undefined1 *puVar14;
  char *format;
  uint index;
  ulong uVar15;
  int i;
  long lVar16;
  FName local_5c;
  ulong local_58;
  cycle_t timer;
  TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> checked;
  
  timer.Sec = 0.0;
  cycle_t::Clock(&timer);
  FScriptPosition::WarnCounter = 0;
  FScriptPosition::ErrorCounter = 0;
  InitThingdef();
  FScriptPosition::StrictErrors = true;
  ParseScripts();
  FScriptPosition::StrictErrors = false;
  ParseAllDecorate();
  FFunctionBuildList::Build(&FunctionBuildList);
  if (0 < FScriptPosition::ErrorCounter) {
    I_Error("%d errors while parsing DECORATE scripts");
  }
  FScriptPosition::WarnCounter = 0;
  FScriptPosition::ErrorCounter = 0;
  uVar15 = (ulong)PClassActor::AllActorClasses.Count;
  do {
    uVar13 = 1;
    do {
      do {
        while( true ) {
          uVar15 = uVar15 - 1;
          index = (uint)uVar15;
          if ((int)index < 0) {
            if (0 < FScriptPosition::ErrorCounter) {
              I_Error("%d errors during actor postprocessing");
            }
            cycle_t::Unclock(&timer);
            if (batchrun == false) {
              Printf("script parsing took %.2f ms\n",timer.Sec * 1000.0);
            }
            for (lVar12 = 0; lVar12 != 0xf8; lVar12 = lVar12 + 8) {
              mysnprintf((char *)&checked,0x14,"QuestItem%d",(ulong)uVar13);
              pPVar8 = PClass::FindActor((char *)&checked);
              *(PClassActor **)((long)QuestItemClasses + lVar12) = pPVar8;
              uVar13 = uVar13 + 1;
            }
            TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>::
            Clear(&StateSourceLines,1);
            return;
          }
          pPVar8 = PClassActor::AllActorClasses.Array[index & 0x7fffffff];
          if (*(int *)((long)&(pPVar8->super_PClass).super_PNativeStruct.super_PStruct.
                              super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase +
                      0x24) != -1) break;
          pcVar9 = FName::NameData.NameArray
                   [(pPVar8->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                    TypeName.Index].Text;
          if ((*(byte *)((long)&(pPVar8->super_PClass).super_PNativeStruct.super_PStruct.
                                super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase +
                        0x21) & 8) == 0) {
            format = "\x1cGClass %s referenced but not defined\n";
LAB_00501414:
            Printf(format,pcVar9);
            FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
          }
          else {
            Printf("\x1cIClass %s referenced but not defined\n");
            FScriptPosition::WarnCounter = FScriptPosition::WarnCounter + 1;
            DObject::StaticPointerSubstitution((DObject *)pPVar8,(DObject *)0x0,false);
            TArray<PClassActor_*,_PClassActor_*>::Delete(&PClassActor::AllActorClasses,index);
          }
        }
        if ((pPVar8->super_PClass).Defaults == (BYTE *)0x0) {
          pcVar9 = FName::NameData.NameArray
                   [(pPVar8->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                    TypeName.Index].Text;
          format = "\x1cGNo ActorInfo defined for class \'%s\'\n";
          goto LAB_00501414;
        }
        local_58 = uVar15;
        TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::TMap(&checked);
        CheckStateLabels(pPVar8,(ENamedName *)CheckStates(PClassActor*)::actorstates,1,
                         "actor sprites");
        bVar2 = PClass::IsAncestorOf(AWeapon::RegistrationInfo.MyClass,&pPVar8->super_PClass);
        puVar14 = CheckStates(PClassActor*)::weaponstates;
        iVar11 = 4;
        pcVar9 = "weapon sprites";
        if (bVar2) {
LAB_005012f4:
          CheckStateLabels(pPVar8,(ENamedName *)puVar14,iVar11,pcVar9);
        }
        else {
          bVar2 = PClass::IsAncestorOf
                            (ACustomInventory::RegistrationInfo.MyClass,&pPVar8->super_PClass);
          puVar14 = CheckStates(PClassActor*)::pickupstates;
          iVar11 = 8;
          pcVar9 = "CustomInventory state chain";
          if (bVar2) goto LAB_005012f4;
        }
        lVar12 = 0;
        for (lVar16 = 0; lVar16 < pPVar8->NumOwnedStates; lVar16 = lVar16 + 1) {
          pFVar4 = pPVar8->OwnedStates;
          lVar1 = *(long *)((long)&pFVar4->NextState + lVar12);
          if ((lVar1 != 0) && (((&pFVar4->UseFlags)[lVar12] & ~*(byte *)(lVar1 + 0x1d)) != 0)) {
            pFVar3 = GetStateSource((FState *)((long)&pFVar4->NextState + lVar12));
            FScriptPosition::Message
                      (pFVar3,2,
                       "\x1cGState %s.%d links to a state with incompatible restrictions.\n",
                       FName::NameData.NameArray
                       [(pPVar8->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                        TypeName.Index].Text,
                       ((long)pFVar4 + (lVar12 - (long)pPVar8->OwnedStates)) / 0x28 & 0xffffffff);
          }
          lVar12 = lVar12 + 0x28;
        }
        TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::~TMap(&checked);
        uVar15 = local_58;
      } while ((pPVar8->super_PClass).bDecorateClass != true);
      bVar2 = PClass::IsAncestorOf(AStateProvider::RegistrationInfo.MyClass,&pPVar8->super_PClass);
    } while (!bVar2);
    TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::TMap(&checked);
    bVar2 = PClass::IsAncestorOf(AWeapon::RegistrationInfo.MyClass,&pPVar8->super_PClass);
    if (bVar2) {
      iVar11 = *(int *)((long)&(pPVar8->super_PClass).super_PNativeStruct.super_PStruct.
                               super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase +
                       0x24);
      puVar14 = (undefined1 *)&CheckForUnsafeStates(PClassActor*)::weaponstates;
      pPVar10 = AWeapon::RegistrationInfo.MyClass;
LAB_005014ae:
      if (iVar11 != *(int *)((long)&(pPVar10->super_PNativeStruct).super_PStruct.super_PNamedType.
                                    super_PCompoundType.super_PType.super_PTypeBase.super_DObject +
                            0x24)) {
        while( true ) {
          iVar11 = *(int *)puVar14;
          if ((long)iVar11 == 0) break;
          local_5c.Index = iVar11;
          for (pFVar4 = PClassActor::FindState(pPVar8,&local_5c); pFVar4 != (FState *)0x0;
              pFVar4 = pFVar4->NextState) {
            pbVar5 = TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::CheckKey
                               (&checked,pFVar4);
            if (pbVar5 != (bool *)0x0) break;
            pNVar6 = TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::GetNode
                               (&checked,pFVar4);
            (pNVar6->Pair).Value = true;
            if ((pFVar4->ActionFunc != (VMFunction *)0x0) &&
               ((pFVar4->ActionFunc->super_DObject).field_0x26 == '\x01')) {
              pPVar7 = FState::StaticFindStateOwner(pFVar4);
              pFVar3 = GetStateSource(pFVar4);
              FScriptPosition::Message
                        (pFVar3,2,
                         "\x1cGUnsafe state call in state %s.%d which accesses user variables, reached by %s.%s.\n"
                         ,FName::NameData.NameArray
                          [(pPVar7->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType
                           .TypeName.Index].Text,
                         ((long)pFVar4 - (long)pPVar7->OwnedStates) / 0x28 & 0xffffffff,
                         FName::NameData.NameArray
                         [(pPVar8->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                          TypeName.Index].Text,FName::NameData.NameArray[iVar11].Text);
            }
          }
          puVar14 = (undefined1 *)((long)puVar14 + 4);
        }
      }
    }
    else {
      bVar2 = PClass::IsAncestorOf(ACustomInventory::RegistrationInfo.MyClass,&pPVar8->super_PClass)
      ;
      if (bVar2) {
        iVar11 = *(int *)((long)&(pPVar8->super_PClass).super_PNativeStruct.super_PStruct.
                                 super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase +
                         0x24);
        puVar14 = CheckForUnsafeStates(PClassActor*)::pickupstates;
        pPVar10 = ACustomInventory::RegistrationInfo.MyClass;
        goto LAB_005014ae;
      }
    }
    TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::~TMap(&checked);
    uVar15 = local_58;
  } while( true );
}

Assistant:

void LoadActors()
{
	cycle_t timer;

	timer.Reset(); timer.Clock();
	FScriptPosition::ResetErrorCounter();

	InitThingdef();
	FScriptPosition::StrictErrors = true;
	ParseScripts();

	FScriptPosition::StrictErrors = false;
	ParseAllDecorate();

	FunctionBuildList.Build();

	if (FScriptPosition::ErrorCounter > 0)
	{
		I_Error("%d errors while parsing DECORATE scripts", FScriptPosition::ErrorCounter);
	}
	FScriptPosition::ResetErrorCounter();

	for (int i = PClassActor::AllActorClasses.Size() - 1; i >= 0; i--)
	{
		auto ti = PClassActor::AllActorClasses[i];
		if (ti->Size == TentativeClass)
		{
			if (ti->ObjectFlags & OF_Transient)
			{
				Printf(TEXTCOLOR_ORANGE "Class %s referenced but not defined\n", ti->TypeName.GetChars());
				FScriptPosition::WarnCounter++;
				DObject::StaticPointerSubstitution(ti, nullptr);
				PClassActor::AllActorClasses.Delete(i);
			}
			else
			{
				Printf(TEXTCOLOR_RED "Class %s referenced but not defined\n", ti->TypeName.GetChars());
				FScriptPosition::ErrorCounter++;
			}
			continue;
		}

		if (GetDefaultByType(ti) == nullptr)
		{
			Printf(TEXTCOLOR_RED "No ActorInfo defined for class '%s'\n", ti->TypeName.GetChars());
			FScriptPosition::ErrorCounter++;
			continue;
		}


		CheckStates(ti);

		if (ti->bDecorateClass && ti->IsDescendantOf(RUNTIME_CLASS(AStateProvider)))
		{
			// either a DECORATE based weapon or CustomInventory. 
			// These are subject to relaxed rules for user variables in states.
			// Although there is a runtime check for bogus states, let's do a quick analysis if any of the known entry points
			// hits an unsafe state. If we can find something here it can be handled wuth a compile error rather than a runtime error.
			CheckForUnsafeStates(ti);
		}

	}
	if (FScriptPosition::ErrorCounter > 0)
	{
		I_Error("%d errors during actor postprocessing", FScriptPosition::ErrorCounter);
	}

	timer.Unclock();
	if (!batchrun) Printf("script parsing took %.2f ms\n", timer.TimeMS());

	// Since these are defined in DECORATE now the table has to be initialized here.
	for (int i = 0; i < 31; i++)
	{
		char fmt[20];
		mysnprintf(fmt, countof(fmt), "QuestItem%d", i + 1);
		QuestItemClasses[i] = PClass::FindActor(fmt);
	}
	StateSourceLines.Clear();
}